

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O3

RelationsMap * __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::getAugmentedRelated
          (RelationsMap *__return_storage_ptr__,RelationsGraph<dg::vr::ValueRelations> *this,
          Bucket *start,Relations *relations,bool toFirstStrict)

{
  _Rb_tree_header *p_Var1;
  Type TVar2;
  pointer pDVar3;
  bool bVar4;
  char cVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  Type strictRel;
  pair<std::_Rb_tree_iterator<dg::vr::Bucket::RelationEdge>,_std::_Rb_tree_iterator<dg::vr::Bucket::RelationEdge>_>
  pVar9;
  iterator it_1;
  Visited firstStrictEdges;
  Visited nestedVisited;
  undefined1 local_180 [16];
  _Link_type local_170;
  pointer pDStack_168;
  pointer local_160;
  reference_wrapper<std::set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>_>
  local_158;
  _Base_ptr local_150;
  _Base_ptr local_148;
  EdgeIterator local_140;
  Relations *local_110;
  _Rb_tree_node_base *local_108;
  EdgeIterator local_100;
  _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
  local_d0;
  iterator local_a0;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d0._M_impl.super__Rb_tree_header._M_header;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_110 = relations;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
  begin_related(&local_a0,this,start,relations);
  pDVar3 = (pointer)(local_180 + 8);
  do {
    iVar6 = getItFor(this,start);
    local_150 = (_Base_ptr)std::_Rb_tree_increment(iVar6._M_node);
    local_180._8_4_ = _S_red;
    local_170 = (_Link_type)0x0;
    local_158._M_data =
         (set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
          *)0x0;
    local_140.allowedEdges.bits.super__Base_bitset<1UL>._M_w = (bitset<12UL>)(_Base_bitset<1UL>)0x0;
    local_140.undirectedOnly = false;
    local_140.relationsFocused = false;
    local_140.stack.
    super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_140.stack.
    super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_140.stack.
    super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pDStack_168 = pDVar3;
    local_160 = pDVar3;
    local_148 = local_150;
    local_140.visited._M_data =
         (set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
          *)local_180;
    if (local_a0.bucketIt._M_node == local_150) {
      bVar4 = operator==(&local_a0.edgeIt,&local_140);
      if (local_140.stack.
          super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_140.stack.
                        super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_140.stack.
                              super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_140.stack.
                              super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
      ::_M_erase((_Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
                  *)local_180,local_170);
      if (bVar4) {
        if (local_a0.edgeIt.stack.
            super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.edgeIt.stack.
                          super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_a0.edgeIt.stack.
                                super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a0.edgeIt.stack.
                                super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
        ::_M_erase((_Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
                    *)&local_a0,
                   (_Link_type)
                   local_a0.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        local_a0.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_a0.visited._M_t._M_impl.super__Rb_tree_header._M_header;
        local_a0.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_a0.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_a0.visited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_a0.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_a0.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((_Rb_tree_header *)local_d0._M_impl.super__Rb_tree_header._M_header._M_left ==
            &local_d0._M_impl.super__Rb_tree_header) {
LAB_00122b8f:
          std::
          _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
          ::_M_erase((_Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
                      *)&local_a0,
                     (_Link_type)
                     local_a0.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
          std::
          _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
          ::_M_erase(&local_d0,
                     (_Link_type)local_d0._M_impl.super__Rb_tree_header._M_header._M_parent);
          return __return_storage_ptr__;
        }
        p_Var8 = local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_00122a24:
        TVar2 = *(Type *)&p_Var8[1]._M_parent;
        local_180._0_8_ = (local_110->bits).super__Base_bitset<1UL>._M_w;
        local_180._8_2_ = 0x101;
        local_170 = (_Link_type)0x0;
        pDStack_168 = (pointer)0x0;
        local_160 = (pointer)0x0;
        local_158._M_data = &local_a0.visited;
        local_108 = p_Var8;
        std::
        vector<dg::vr::Bucket::DirectRelIterator,std::allocator<dg::vr::Bucket::DirectRelIterator>>
        ::emplace_back<dg::vr::Bucket_const&>
                  ((vector<dg::vr::Bucket::DirectRelIterator,std::allocator<dg::vr::Bucket::DirectRelIterator>>
                    *)&local_170,(Bucket *)p_Var8[1]._M_left);
        do {
          Bucket::EdgeIterator::nextViableEdge((EdgeIterator *)local_180);
          while( true ) {
            local_100.allowedEdges.bits.super__Base_bitset<1UL>._M_w =
                 (bitset<12UL>)(_Base_bitset<1UL>)0x0;
            local_100.undirectedOnly = false;
            local_100.relationsFocused = false;
            local_100.stack.
            super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_100.stack.
            super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_100.stack.
            super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_100.visited._M_data = &local_a0.visited;
            bVar4 = operator==((EdgeIterator *)local_180,&local_100);
            if (local_100.stack.
                super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_100.stack.
                              super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_100.stack.
                                    super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_100.stack.
                                    super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (bVar4) {
              if (local_170 != (_Link_type)0x0) {
                operator_delete(local_170,(long)local_160 - (long)local_170);
              }
              p_Var8 = (_Base_ptr)std::_Rb_tree_increment(local_108);
              if ((_Rb_tree_header *)p_Var8 == &local_d0._M_impl.super__Rb_tree_header)
              goto LAB_00122b8f;
              goto LAB_00122a24;
            }
            local_100.allowedEdges.bits.super__Base_bitset<1UL>._M_w =
                 (bitset<12UL>)pDStack_168[-1].current._to._M_data;
            pDVar3 = pDStack_168 + -1;
            pmVar7 = std::
                     map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                     ::operator[](__return_storage_ptr__,(key_type *)&local_100);
            bVar4 = processEdge(&pDVar3->current,TVar2,pmVar7,toFirstStrict,(Visited *)&local_d0);
            if (bVar4) break;
            Bucket::EdgeIterator::operator++((EdgeIterator *)local_180);
          }
          pVar9 = std::
                  _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
                  ::equal_range((_Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
                                 *)&local_a0,&pDStack_168[-1].current);
          std::
          _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
          ::_M_erase_aux((_Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
                          *)&local_a0,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node
                        );
          pDStack_168[-1].bucketIt._M_current = pDStack_168[-1].bucketIt._M_current + 1;
        } while( true );
      }
    }
    else {
      std::
      _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
      ::_M_erase((_Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
                  *)local_180,(_Link_type)0x0);
    }
    local_180._0_8_ =
         local_a0.edgeIt.stack.
         super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].current._to._M_data;
    pmVar7 = std::
             map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
             ::operator[](__return_storage_ptr__,(key_type *)local_180);
    TVar2 = local_a0.edgeIt.stack.
            super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].current._rel;
    if (0xb < (ulong)TVar2) {
      std::__throw_out_of_range_fmt
                ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",(ulong)TVar2,
                 0xc);
    }
    (pmVar7->bits).super__Base_bitset<1UL>._M_w =
         (pmVar7->bits).super__Base_bitset<1UL>._M_w | 1L << ((byte)TVar2 & 0x3f);
    cVar5 = dg::vr::Relations::isStrict
                      (local_a0.edgeIt.stack.
                       super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].current._rel);
    if (cVar5 == '\0') {
      Bucket::EdgeIterator::operator++(&local_a0.edgeIt);
    }
    else {
      std::
      _Rb_tree<dg::vr::Bucket::RelationEdge,dg::vr::Bucket::RelationEdge,std::_Identity<dg::vr::Bucket::RelationEdge>,std::less<dg::vr::Bucket::RelationEdge>,std::allocator<dg::vr::Bucket::RelationEdge>>
      ::_M_emplace_unique<dg::vr::Bucket::RelationEdge_const&>
                ((_Rb_tree<dg::vr::Bucket::RelationEdge,dg::vr::Bucket::RelationEdge,std::_Identity<dg::vr::Bucket::RelationEdge>,std::less<dg::vr::Bucket::RelationEdge>,std::allocator<dg::vr::Bucket::RelationEdge>>
                  *)&local_d0,
                 &local_a0.edgeIt.stack.
                  super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].current);
      local_a0.edgeIt.stack.
      super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].bucketIt._M_current =
           local_a0.edgeIt.stack.
           super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].bucketIt._M_current + 1;
      Bucket::EdgeIterator::nextViableEdge(&local_a0.edgeIt);
    }
    EdgeIterator::nextViableEdge(&local_a0);
  } while( true );
}

Assistant:

RelationsMap getAugmentedRelated(const Bucket &start,
                                     const Relations &relations,
                                     bool toFirstStrict) const {
        RelationsMap result;

        Bucket::iterator::Visited firstStrictEdges;
        for (auto it = begin_related(start, relations);
             it != end_related(start);
             /*incremented in body */) {
            result[it->to()].set(it->rel());

            if (Relations::isStrict(it->rel())) {
                firstStrictEdges.emplace(*it);
                it.skipSuccessors();
            } else
                ++it;
        }

        Bucket::iterator::Visited nestedVisited;
        for (Bucket::RelationEdge edge : firstStrictEdges) {
            const Bucket &nestedStart = edge.to();
            Relations::Type strictRel = edge.rel();

            bool shouldSkip = false;
            for (auto it = nestedStart.begin(nestedVisited, relations, true,
                                             true);
                 it != nestedStart.end(nestedVisited);
                 shouldSkip ? it.skipSuccessors() : ++it) {
                shouldSkip = processEdge(*it, strictRel, result[it->to()],
                                         toFirstStrict, firstStrictEdges);
                if (shouldSkip)
                    nestedVisited.erase(*it);
            }
        }
        return result;
    }